

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,char *str,qsizetype len,qsizetype from)

{
  ulong uVar1;
  bool bVar2;
  qsizetype qVar3;
  byte *pbVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  byte *pbVar8;
  
  lVar6 = 0;
  if (0 < from) {
    lVar6 = from;
  }
  uVar1 = (this->field_2).p.l;
  if (uVar1 == 0) {
    qVar3 = -1;
    if (lVar6 <= len) {
      qVar3 = lVar6;
    }
    return qVar3;
  }
  lVar7 = -uVar1;
  pbVar4 = (byte *)(str + uVar1 + lVar6 + -1);
  do {
    if (str + len <= pbVar4) {
      return -1;
    }
    uVar5 = (ulong)*(byte *)((long)&this->field_2 + (ulong)*pbVar4);
    if (uVar5 == 0) {
      uVar5 = uVar1;
      pbVar8 = pbVar4;
      if ((long)uVar1 < 1) {
        lVar7 = 0;
LAB_003060ba:
        return (qsizetype)(pbVar4 + (lVar7 - (long)str) + 1);
      }
      while (*pbVar8 == (this->field_2).p.p[uVar5 - 1]) {
        uVar5 = uVar5 - 1;
        pbVar8 = pbVar8 + -1;
        if (uVar5 == 0) goto LAB_003060ba;
      }
      if (uVar1 != *(byte *)((long)&this->field_2 + (ulong)*pbVar8)) {
        uVar5 = 1;
      }
    }
    bVar2 = str + len + -uVar5 < pbVar4;
    pbVar4 = pbVar4 + uVar5;
    if (bVar2) {
      return -1;
    }
  } while( true );
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(const char *str, qsizetype len, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(str), len, from,
                   p.p, p.l, p.q_skiptable);
}